

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

int __thiscall libtorrent::aux::peer_connection::timeout(peer_connection *this)

{
  int local_14;
  int ret;
  peer_connection *this_local;
  
  local_14 = session_settings::get_int((this->super_peer_connection_hot_members).m_settings,0x400a);
  if ((this->m_peer_info != (torrent_peer *)0x0) &&
     ((*(uint *)&this->m_peer_info->field_0x1b >> 0x19 & 1) != 0)) {
    local_14 = local_14 << 2;
  }
  return local_14;
}

Assistant:

int peer_connection::timeout() const
	{
		TORRENT_ASSERT(is_single_thread());
		int ret = m_settings.get_int(settings_pack::peer_timeout);
#if TORRENT_USE_I2P
		if (m_peer_info && m_peer_info->is_i2p_addr)
		{
			// quadruple the timeout for i2p peers
			ret *= 4;
		}
#endif
		return ret;
	}